

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O1

size_t __thiscall
TransitionObservationIndependentMADPDiscrete::CreateJointActionsRecursively
          (TransitionObservationIndependentMADPDiscrete *this,Index curAgentI,
          JointActionDiscrete *ja,Index jaI)

{
  pointer *pppJVar1;
  size_t sVar2;
  iterator __position;
  ulong uVar3;
  ActionDiscrete *a;
  JointActionDiscrete *this_00;
  size_t sVar4;
  Index jaI_00;
  Index a_00;
  ulong uVar5;
  JointActionDiscrete *p_ja;
  JointActionDiscrete *local_78;
  JointActionDiscrete *local_70;
  Index local_64;
  ulong local_60;
  vector<JointActionDiscrete*,std::allocator<JointActionDiscrete*>> *local_58;
  ulong local_50;
  JointActionDiscrete *local_48;
  ActionDiscrete *local_40;
  ulong local_38;
  
  sVar4 = (size_t)jaI;
  sVar2 = (this->super_MultiAgentDecisionProcess)._m_nrAgents;
  uVar3 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x48))();
  local_70 = (JointActionDiscrete *)operator_new(0x48);
  local_48 = ja;
  JointActionDiscrete::JointActionDiscrete(local_70,ja);
  if (uVar3 != 0) {
    local_60 = (ulong)curAgentI;
    local_38 = uVar3 - 1;
    local_64 = curAgentI + 1;
    local_58 = (vector<JointActionDiscrete*,std::allocator<JointActionDiscrete*>> *)
               &this->_m_jointActionVec;
    uVar5 = 0;
    local_50 = uVar3;
    do {
      a_00 = (Index)uVar5;
      a = MADPComponentDiscreteActions::GetActionDiscrete
                    (&(this->_m_individualMADPDs).
                      super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_60]->_m_A,0,a_00);
      this_00 = local_48;
      if ((a_00 != 0) && (this_00 = local_70, local_38 != uVar5)) {
        local_40 = a;
        this_00 = (JointActionDiscrete *)operator_new(0x48);
        JointActionDiscrete::JointActionDiscrete(this_00,local_70);
        a = local_40;
        uVar3 = local_50;
      }
      local_78 = this_00;
      jaI_00 = (Index)sVar4;
      if (sVar2 - 1 == local_60) {
        (local_78->super_DiscreteEntity)._m_index = jaI_00;
        JointActionDiscrete::AddIndividualAction(local_78,a,curAgentI);
        __position._M_current =
             (this->_m_jointActionVec).
             super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->_m_jointActionVec).
            super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<JointActionDiscrete*,std::allocator<JointActionDiscrete*>>::
          _M_realloc_insert<JointActionDiscrete*const&>(local_58,__position,&local_78);
        }
        else {
          *__position._M_current = local_78;
          pppJVar1 = &(this->_m_jointActionVec).
                      super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppJVar1 = *pppJVar1 + 1;
        }
        sVar4 = (size_t)(jaI_00 + 1);
      }
      else {
        JointActionDiscrete::AddIndividualAction(local_78,a,curAgentI);
        sVar4 = CreateJointActionsRecursively(this,local_64,local_78,jaI_00);
      }
      uVar5 = (ulong)(a_00 + 1);
    } while (uVar5 < uVar3);
  }
  return sVar4 & 0xffffffff;
}

Assistant:

size_t TransitionObservationIndependentMADPDiscrete::
CreateJointActionsRecursively(Index curAgentI, JointActionDiscrete& ja, 
        Index jaI)
{
if(DEBUG_CJA)    cerr << "TransitionObservationIndependentMADPDiscrete::CreateJointActions(Index "<<curAgentI<<", JointActionDiscrete& ja, Index "<< jaI<<") called"<<endl;

    bool lastAgent=false;
    if(curAgentI == _m_nrAgents-1)
    {
        lastAgent = true;    
        if(DEBUG_CJA)     cerr << "\nlast agent\n";
    }

    //we are going to walk through this agents action vector
    size_t nrA = GetNrActions(curAgentI);
    
    //first action extends the received ja 
    JointActionDiscrete* p_jaReceivedArgCopy = new JointActionDiscrete(ja);
    JointActionDiscrete* p_ja;
    
    for(Index a=0; a < nrA; a++)
    {
        const ActionDiscrete * adp = GetIndividualMADPD(curAgentI)->
            GetActionDiscrete(0, a);
        if(DEBUG_CJA) cerr << "\nnext action";
//        if(it == first) //
        if(a == 0)      
        {
            if(DEBUG_CJA) cerr << "(first action - not making copy)\n";
            p_ja = &ja;
        }
        else if ( a == nrA-1 )//it == beforelast)
            //this is the last last action   
        {
            if(DEBUG_CJA) cerr << "(last action - not making copy)\n";
            p_ja = p_jaReceivedArgCopy; //don't make a new copy
        }
        else //make a new copy
        {        
            if(DEBUG_CJA) cerr << "(intermed. action - making copy)\n";
            p_ja = new JointActionDiscrete(*p_jaReceivedArgCopy);    
        }    
        if(lastAgent)
        {
            p_ja->SetIndex(jaI);
            if(DEBUG_CJA)cerr << "setting index of this joint action to: "<< 
                jaI <<endl;
        }
//        ActionDiscrete* adp = /*(ActionDiscrete*)*/ &(*it);
        if(DEBUG_CJA)
            cerr <<"Adding agent's indiv. action to joint action..."<<endl;
        p_ja->AddIndividualAction(adp, curAgentI);        
        if(lastAgent) //jointAction is now completed: add it to jointAction set.
        {
            if(DEBUG_CJA){cerr << "INSERTING the joint action:"; 
                p_ja->Print();cerr<<endl;}
            _m_jointActionVec.push_back(p_ja);
            if(DEBUG_CJA){cerr << "\nINSERTED the joint action."<<endl;
                cerr << "_m_jointActionVec now containts "<< 
                _m_jointActionVec.size() << " joint actions." << endl;}
            jaI++;
        }
        else
            jaI = CreateJointActionsRecursively(curAgentI+1,*p_ja, jaI);
        
//        it++;
    }
    if(DEBUG_CJA)    cerr << ">>ProblemDecTiger::CreateJointActionsRecursively(Index "<<curAgentI<<", JointActionDiscrete& ja, Index "<< jaI<<") FINISHED"<<endl;
    return jaI;
}